

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

int spill_el_cmp(spill_el_t *e1,spill_el_t *e2)

{
  char cVar1;
  edge_t_conflict peVar2;
  edge_t_conflict peVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  
  cVar1 = e1->edge_p;
  iVar4 = (int)cVar1;
  iVar6 = (int)e2->edge_p;
  if (cVar1 == e2->edge_p) {
    peVar2 = (e1->u).e;
    peVar3 = (e2->u).e;
    if (cVar1 == '\0') {
      if (peVar2 != peVar3) {
        bVar7 = peVar2->src < peVar3->src;
        goto LAB_001709b1;
      }
      cVar1 = e1->bb_end_p;
      if (cVar1 != e2->bb_end_p) {
        return (int)cVar1 - (int)e2->bb_end_p;
      }
      iVar6 = (int)e1->spill_p;
      iVar4 = (int)e2->spill_p;
      if (e1->spill_p == e2->spill_p) goto LAB_001709cf;
      if (cVar1 == '\0') {
        return iVar6 - iVar4;
      }
    }
    else {
      bVar7 = peVar2 < peVar3;
      if (peVar2 != peVar3) {
LAB_001709b1:
        return -(uint)bVar7 | 1;
      }
      iVar6 = (int)e1->spill_p;
      iVar4 = (int)e2->spill_p;
      if (e1->spill_p == e2->spill_p) {
LAB_001709cf:
        uVar5 = 0;
        if (e1->reg != e2->reg) {
          uVar5 = -(uint)(e1->reg < e2->reg) | 1;
        }
        return uVar5;
      }
    }
  }
  return iVar4 - iVar6;
}

Assistant:

static int spill_el_cmp (const spill_el_t *e1, const spill_el_t *e2) {
  if (e1->edge_p != e2->edge_p) return e1->edge_p - e2->edge_p; /* put bb first */
  if (e1->edge_p && e1->u.e != e2->u.e) return e1->u.e < e2->u.e ? -1 : 1;
  if (!e1->edge_p && e1->u.bb != e2->u.bb) return e1->u.bb->index < e2->u.bb->index ? -1 : 1;
  if (!e1->edge_p && e1->bb_end_p != e2->bb_end_p)
    return e1->bb_end_p - e2->bb_end_p; /* start first */
  if (e1->spill_p != e2->spill_p)       /* load first for bb start, store first otherwise: */
    return !e1->edge_p && !e1->bb_end_p ? e1->spill_p - e2->spill_p : e2->spill_p - e1->spill_p;
  return e1->reg == e2->reg ? 0 : e1->reg < e2->reg ? -1 : 1; /* smaller reg first */
}